

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O0

AST * parse_relational_expression(Translation_Data *translation_data,Scope *scope)

{
  AST *pAVar1;
  AST_Binary_Expression *local_28;
  AST *hold;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  local_28 = (AST_Binary_Expression *)parse_shift_expression(translation_data,scope);
  while (translation_data->tokens->size != 0) {
    switch(*translation_data->tokens->first->data) {
    case 0x2f:
      chomp(translation_data);
      pAVar1 = parse_shift_expression(translation_data,scope);
      local_28 = get_binary_expression_tree((AST *)local_28,pAVar1,OP_LESS);
      break;
    default:
      return (AST *)local_28;
    case 0x32:
      chomp(translation_data);
      pAVar1 = parse_shift_expression(translation_data,scope);
      local_28 = get_binary_expression_tree((AST *)local_28,pAVar1,OP_GREATER);
      break;
    case 0x41:
      chomp(translation_data);
      pAVar1 = parse_shift_expression(translation_data,scope);
      local_28 = get_binary_expression_tree((AST *)local_28,pAVar1,OP_LESS_EQ);
      break;
    case 0x42:
      chomp(translation_data);
      pAVar1 = parse_shift_expression(translation_data,scope);
      local_28 = get_binary_expression_tree((AST *)local_28,pAVar1,OP_GREATER_EQ);
    }
  }
  return (AST *)local_28;
}

Assistant:

struct AST* parse_relational_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct AST *hold;
	hold=parse_shift_expression(translation_data,scope);

	while(translation_data->tokens->size!=0)
	{
		switch(((struct token*)translation_data->tokens->first->data)->type)
		{
			case KW_LESS:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_shift_expression(translation_data,scope),OP_LESS);
				break;
			case KW_LESS_EQ:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_shift_expression(translation_data,scope),OP_LESS_EQ);
				break;
			case KW_MORE:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_shift_expression(translation_data,scope),OP_GREATER);
				break;
			case KW_MORE_EQ:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_shift_expression(translation_data,scope),OP_GREATER_EQ);
				break;
			default:
				return hold;
		}
	}
	return hold;
}